

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::genGeometrySource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  ostringstream buf;
  undefined1 local_1a0 [376];
  
  bVar1 = *(byte *)((long)this + 0x80);
  pcVar4 = "vtx_color";
  if (bVar1 != 0) {
    pcVar4 = "tess_color";
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"${GLSL_VERSION_DECL}\n${GEOMETRY_SHADER_REQUIRE}\n",0x30);
  pcVar2 = glcts::fixed_sample_locations_values + 1;
  bVar5 = *(char *)((long)this + 0xd8) != '\0';
  if (bVar5) {
    pcVar2 = "${GEOMETRY_POINT_SIZE}\n";
  }
  lVar3 = 0x17;
  if (!bVar5) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar2,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "layout(points) in;\nlayout(max_vertices=3, points) out;\n\nin highp vec4 ",0x46);
  lVar3 = (ulong)bVar1 + 9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "[1];\nout highp vec4 geo_color;\nuniform highp vec4 u_posScale;\n\nflat in highp vec3 v_geo_bbox_clipMin[1];\nflat in highp vec3 v_geo_bbox_clipMax[1];\nflat out highp vec3 v_bbox_clipMin;\nflat out highp vec3 v_bbox_clipMax;\nflat out highp float v_bbox_expansionSize;\n\n"
             ,0x107);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "vec4 mirrorX(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(2.0 * patternCenter.x - p.x, p.y, p.z, p.w);\n}\n"
             ,0xf1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "\nvoid main()\n{\n\t// Non-trivial geometry shader: 1-to-3 amplification, mirror horizontally\n\thighp vec4 p0 = mirrorX(gl_in[0].gl_Position);\n\thighp vec4 pointColor = "
             ,0xa3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "[0];\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp float pointSize = ",0x48);
  pcVar4 = "1.0";
  bVar5 = *(char *)((long)this + 0xd8) != '\0';
  if (bVar5) {
    pcVar4 = "(pointColor.g > 0.0) ? (5.0) : (3.0)";
  }
  lVar3 = 3;
  if (bVar5) {
    lVar3 = 0x24;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             ";\n\n\thighp vec4 offsets[3] =\n\t\tvec4[3](\n\t\t\tvec4( 0.05 * patternScale.x, 0.03 * patternScale.y, 0.0, 0.0),\n\t\t\tvec4(-0.01 * patternScale.x,-0.02 * patternScale.y, 0.0, 0.0),\n\t\t\tvec4(-0.05 * patternScale.x, 0.02 * patternScale.y, 0.0, 0.0)\n\t\t);\n\tfor (int ndx = 0; ndx < 3; ++ndx)\n\t{\n\t\tgl_Position = p0 + offsets[ndx];\n"
             ,0x13a);
  if (*(char *)((long)this + 0xd8) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"\t\tgl_PointSize = pointSize;\n",0x1c);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "\t\tv_bbox_clipMin = v_geo_bbox_clipMin[0];\n\t\tv_bbox_clipMax = v_geo_bbox_clipMax[0];\n\t\tv_bbox_expansionSize = pointSize;\n\t\tgeo_color = pointColor;\n\t\tEmitVertex();\n\t}\n}\n"
             ,0xa7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string PointRenderCase::genGeometrySource (void) const
{
	const char* const	colorInputName = (m_hasTessellationStage) ? ("tess_color") : ("vtx_color");
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GEOMETRY_SHADER_REQUIRE}\n"
		<<	((m_isWidePointCase) ? ("${GEOMETRY_POINT_SIZE}\n") : (""))
		<<	"layout(points) in;\n"
			"layout(max_vertices=3, points) out;\n"
			"\n"
			"in highp vec4 " << colorInputName << "[1];\n"
			"out highp vec4 geo_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"\n"
			"flat in highp vec3 v_geo_bbox_clipMin[1];\n"
			"flat in highp vec3 v_geo_bbox_clipMax[1];\n"
			"flat out highp vec3 v_bbox_clipMin;\n"
			"flat out highp vec3 v_bbox_clipMax;\n"
			"flat out highp float v_bbox_expansionSize;\n"
			"\n"
		<<	genShaderFunction(SHADER_FUNC_MIRROR_X)
		<<	"\n"
			"void main()\n"
			"{\n"
			"	// Non-trivial geometry shader: 1-to-3 amplification, mirror horizontally\n"
			"	highp vec4 p0 = mirrorX(gl_in[0].gl_Position);\n"
			"	highp vec4 pointColor = " << colorInputName << "[0];\n"
			"	highp vec2 patternScale = u_posScale.zw;\n"
			"	highp float pointSize = "
				<< (m_isWidePointCase ? ("(pointColor.g > 0.0) ? (5.0) : (3.0)") : ("1.0"))
				<< ";\n"
			"\n"
			"	highp vec4 offsets[3] =\n"
			"		vec4[3](\n"
			"			vec4( 0.05 * patternScale.x, 0.03 * patternScale.y, 0.0, 0.0),\n"
			"			vec4(-0.01 * patternScale.x,-0.02 * patternScale.y, 0.0, 0.0),\n"
			"			vec4(-0.05 * patternScale.x, 0.02 * patternScale.y, 0.0, 0.0)\n"
			"		);\n"
			"	for (int ndx = 0; ndx < 3; ++ndx)\n"
			"	{\n"
			"		gl_Position = p0 + offsets[ndx];\n";

	if (m_isWidePointCase)
		buf <<	"		gl_PointSize = pointSize;\n";

	buf <<	"		v_bbox_clipMin = v_geo_bbox_clipMin[0];\n"
			"		v_bbox_clipMax = v_geo_bbox_clipMax[0];\n"
			"		v_bbox_expansionSize = pointSize;\n"
			"		geo_color = pointColor;\n"
			"		EmitVertex();\n"
			"	}\n"
			"}\n";

	return buf.str();
}